

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O3

void __thiscall ki::dml::Record::Record(Record *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  local_48;
  
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_write_to_0015db30;
  p_Var1 = &(this->m_field_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_fields).super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fields).super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fields).super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &local_48._M_impl.super__Rb_tree_header;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl._0_8_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::clear(&(this->m_field_map)._M_t);
  if (local_48._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_48._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_48._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_48._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_48._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_48._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (this->m_field_map)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_48._M_impl.super__Rb_tree_header._M_node_count;
    local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_48._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_48._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::~_Rb_tree(&local_48);
  return;
}

Assistant:

Record::Record()
	{
		m_fields = FieldList();
		m_field_map = FieldNameMap();
	}